

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gls::(anonymous_namespace)::generateToVec4Expression_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Attribute *attrib,int id)

{
  int iVar1;
  deUint32 dVar2;
  string *__lhs;
  ostream *poVar3;
  AttribType local_258;
  undefined1 local_230 [8];
  ostringstream src;
  bool local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string variableName;
  int id_local;
  Attribute *attrib_local;
  
  variableName.field_2._12_4_ = SUB84(attrib,0);
  __lhs = AttributeLocationTestUtil::Attribute::getName_abi_cxx11_((Attribute *)this);
  iVar1 = AttributeLocationTestUtil::Attribute::getArraySize((Attribute *)this);
  src._371_1_ = 0;
  src._369_1_ = 0;
  if (iVar1 == -1) {
    std::allocator<char>::allocator();
    src._369_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"",(allocator<char> *)&src.field_0x172);
  }
  else {
    de::toString<int>(&local_a0,(int *)(variableName.field_2._M_local_buf + 0xc));
    std::operator+(&local_80,"[",&local_a0);
    src._371_1_ = 1;
    std::operator+(&local_60,&local_80,"]");
  }
  local_a1 = iVar1 != -1;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,__lhs
                 ,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if ((src._369_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&src.field_0x172);
  }
  if ((src._371_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_80);
  }
  if (local_a1) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
  AttributeLocationTestUtil::Attribute::getType(&local_258,(Attribute *)this);
  dVar2 = AttributeLocationTestUtil::AttribType::getGLTypeEnum(&local_258);
  AttributeLocationTestUtil::AttribType::~AttribType(&local_258);
  if (dVar2 == 0x8b50) {
LAB_027196ee:
    poVar3 = std::operator<<((ostream *)local_230,"vec4(");
    poVar3 = std::operator<<(poVar3,(string *)local_40);
    poVar3 = std::operator<<(poVar3,".xy, ");
    poVar3 = std::operator<<(poVar3,(string *)local_40);
    std::operator<<(poVar3,".yx)");
  }
  else {
    if (dVar2 != 0x8b51) {
      if (dVar2 == 0x8b53) goto LAB_027196ee;
      if (dVar2 != 0x8b54) {
        if (dVar2 == 0x8dc6) goto LAB_027196ee;
        if (dVar2 != 0x8dc7) {
          poVar3 = std::operator<<((ostream *)local_230,"vec4(");
          poVar3 = std::operator<<(poVar3,(string *)local_40);
          std::operator<<(poVar3,")");
          goto LAB_0271983f;
        }
      }
    }
    poVar3 = std::operator<<((ostream *)local_230,"vec4(");
    poVar3 = std::operator<<(poVar3,(string *)local_40);
    poVar3 = std::operator<<(poVar3,".xyz, ");
    poVar3 = std::operator<<(poVar3,(string *)local_40);
    std::operator<<(poVar3,".x)");
  }
LAB_0271983f:
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string generateToVec4Expression (const Attribute& attrib, int id=-1)
{
	const string		variableName(attrib.getName() + (attrib.getArraySize() != Attribute::NOT_ARRAY ? "[" + de::toString(id) + "]" : ""));
	std::ostringstream	src;

	switch (attrib.getType().getGLTypeEnum())
	{
		case GL_INT_VEC2:
		case GL_UNSIGNED_INT_VEC2:
		case GL_FLOAT_VEC2:
			src << "vec4(" << variableName << ".xy, " << variableName << ".yx)";
			break;

		case GL_INT_VEC3:
		case GL_UNSIGNED_INT_VEC3:
		case GL_FLOAT_VEC3:
			src << "vec4(" << variableName << ".xyz, " << variableName << ".x)";
			break;

		default:
			src << "vec4(" << variableName << ")";
			break;
	}

	return src.str();
}